

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

void __thiscall icu_63::number::impl::SimpleModifier::SimpleModifier(SimpleModifier *this)

{
  SimpleModifier *this_local;
  
  Modifier::Modifier(&this->super_Modifier);
  (this->super_Modifier)._vptr_Modifier = (_func_int **)&PTR__SimpleModifier_0049f960;
  UnicodeString::UnicodeString(&this->fCompiledPattern);
  this->fField = UNUM_FIELD_COUNT;
  this->fStrong = false;
  this->fPrefixLength = 0;
  this->fSuffixOffset = -1;
  this->fSuffixLength = 0;
  Modifier::Parameters::Parameters(&this->fParameters);
  return;
}

Assistant:

SimpleModifier::SimpleModifier()
        : fField(UNUM_FIELD_COUNT), fStrong(false), fPrefixLength(0), fSuffixLength(0) {
}